

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O2

char * crn_get_dxt_quality_string(crn_dxt_quality q)

{
  if (q < cCRNDXTQualityTotal) {
    return &DAT_0018a050 + *(int *)(&DAT_0018a050 + (ulong)q * 4);
  }
  return "?";
}

Assistant:

const char* crn_get_dxt_quality_string(crn_dxt_quality q)
{
    switch (q)
    {
    case cCRNDXTQualitySuperFast:
        return "SuperFast";
    case cCRNDXTQualityFast:
        return "Fast";
    case cCRNDXTQualityNormal:
        return "Normal";
    case cCRNDXTQualityBetter:
        return "Better";
    case cCRNDXTQualityUber:
        return "Uber";
    default:
        break;
    }
    CRNLIB_ASSERT(false);
    return "?";
}